

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::ReadString(CodedInputStream *this,string *buffer,int size)

{
  pointer __dest;
  bool bVar1;
  LogMessageFatal LStack_28;
  
  if (size < 0) {
    bVar1 = false;
  }
  else {
    if (*(int *)&this->buffer_end_ - *(int *)&this->buffer_ < size) {
      bVar1 = ReadStringFallback(this,buffer,size);
      return bVar1;
    }
    std::__cxx11::string::resize((ulong)buffer);
    __dest = (buffer->_M_dataplus)._M_p;
    if (__dest == (pointer)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&LStack_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x108,"z.first != nullptr");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
    }
    memcpy(__dest,this->buffer_,(ulong)(uint)size);
    this->buffer_ = this->buffer_ + (uint)size;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool CodedInputStream::ReadString(std::string* buffer, int size) {
  if (size < 0) return false;  // security: size is often user-supplied

  if (BufferSize() >= size) {
    absl::strings_internal::STLStringResizeUninitialized(buffer, size);
    std::pair<char*, bool> z = as_string_data(buffer);
    if (z.second) {
      // Oddly enough, memcpy() requires its first two args to be non-NULL even
      // if we copy 0 bytes.  So, we have ensured that z.first is non-NULL here.
      ABSL_DCHECK(z.first != nullptr);
      memcpy(z.first, buffer_, size);
      Advance(size);
    }
    return true;
  }

  return ReadStringFallback(buffer, size);
}